

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chpst.c
# Opt level: O1

void edir(char *dirname)

{
  int __fd;
  int iVar1;
  DIR *__dirp;
  int *piVar2;
  dirent *pdVar3;
  ulong uVar4;
  char *pcVar5;
  char *fn;
  
  __fd = open_read(".");
  if (__fd == -1) {
    strerr_die(0x6f,"chpst: fatal: ","unable to open current working directory",": ",(char *)0x0,
               (char *)0x0,(char *)0x0,&strerr_sys);
  }
  iVar1 = chdir(dirname);
  if (iVar1 != 0) {
    strerr_die(0x6f,"chpst: fatal: ","unable to switch to directory",": ",dirname,": ",(char *)0x0,
               &strerr_sys);
  }
  __dirp = opendir(".");
  if (__dirp == (DIR *)0x0) {
    strerr_die(0x6f,"chpst: fatal: ","unable to open directory",": ",dirname,": ",(char *)0x0,
               &strerr_sys);
  }
  piVar2 = __errno_location();
  *piVar2 = 0;
  pdVar3 = readdir(__dirp);
  do {
    if (pdVar3 == (dirent *)0x0) {
      if (*piVar2 != 0) {
        strerr_die(0x6f,"chpst: fatal: ","unable to read directory",": ",dirname,": ",(char *)0x0,
                   &strerr_sys);
      }
      closedir(__dirp);
      iVar1 = fchdir(__fd);
      if (iVar1 == -1) {
        strerr_die(0x6f,"chpst: fatal: ","unable to switch to starting directory",": ",(char *)0x0,
                   (char *)0x0,(char *)0x0,&strerr_sys);
      }
      close(__fd);
      return;
    }
    if (pdVar3->d_name[0] != '.') {
      fn = pdVar3->d_name;
      iVar1 = openreadclose(fn,&sa,0x100);
      if (iVar1 == -1) {
        if ((*piVar2 == error_isdir) && (env_dir != (char *)0x0)) {
          if (verbose != 0) {
            strerr_warn("chpst: warning: ","unable to read ",dirname,"/",fn,": ",&strerr_sys);
          }
          goto LAB_00103a9d;
        }
        strerr_die(0x6f,"chpst: fatal: ","unable to read ",dirname,"/",fn,": ",&strerr_sys);
      }
      if (sa.len == 0) {
        pcVar5 = (char *)0x0;
      }
      else {
        sa.len = byte_chr(sa.s,sa.len,10);
        if (sa.len != 0) {
          uVar4 = (ulong)(sa.len - 1);
          pcVar5 = sa.s + uVar4;
          do {
            if ((*pcVar5 != ' ') && (*pcVar5 != '\t')) break;
            sa.len = (uint)uVar4;
            pcVar5 = pcVar5 + -1;
            uVar4 = (ulong)(sa.len - 1);
          } while (sa.len != 0);
        }
        if (sa.len != 0) {
          uVar4 = 0;
          do {
            if (sa.s[uVar4] == '\0') {
              sa.s[uVar4] = '\n';
            }
            uVar4 = uVar4 + 1;
          } while (uVar4 < sa.len);
        }
        iVar1 = stralloc_append(&sa,"");
        pcVar5 = sa.s;
        if (iVar1 == 0) {
          strerr_die(0x6f,"chpst: fatal: ","out of memory.",(char *)0x0,(char *)0x0,(char *)0x0,
                     (char *)0x0,(strerr *)0x0);
          pcVar5 = sa.s;
        }
      }
      iVar1 = pathexec_env(fn,pcVar5);
      if (iVar1 == 0) {
        strerr_die(0x6f,"chpst: fatal: ","out of memory.",(char *)0x0,(char *)0x0,(char *)0x0,
                   (char *)0x0,(strerr *)0x0);
      }
    }
LAB_00103a9d:
    *piVar2 = 0;
    pdVar3 = readdir(__dirp);
  } while( true );
}

Assistant:

void edir(const char *dirname) {
  int wdir;
  DIR *dir;
  direntry *d;
  int i;

  if ((wdir =open_read(".")) == -1)
    fatal("unable to open current working directory");
  if (chdir(dirname)) fatal2("unable to switch to directory", dirname);
  if (! (dir =opendir("."))) fatal2("unable to open directory", dirname);
  for (;;) {
    errno =0;
    d =readdir(dir);
    if (! d) {
      if (errno) fatal2("unable to read directory", dirname);
      break;
    }
    if (d->d_name[0] == '.') continue;
    if (openreadclose(d->d_name, &sa, 256) == -1) {
      if ((errno == error_isdir) && env_dir) {
        if (verbose)
          strerr_warn6(WARNING, "unable to read ", dirname, "/",
                       d->d_name, ": ", &strerr_sys);
        continue;
      }
      else
        strerr_die6sys(111, FATAL, "unable to read ", dirname, "/",
                             d->d_name, ": ");
    }
    if (sa.len) {
      sa.len =byte_chr(sa.s, sa.len, '\n');
      while (sa.len && (sa.s[sa.len -1] == ' ' || sa.s[sa.len -1] == '\t'))
        --sa.len;
      for (i =0; i < sa.len; ++i) if (! sa.s[i]) sa.s[i] ='\n';
      if (! stralloc_0(&sa)) die_nomem();
      if (! pathexec_env(d->d_name, sa.s)) die_nomem();
    }
    else
      if (! pathexec_env(d->d_name, 0)) die_nomem();
  }
  closedir(dir);
  if (fchdir(wdir) == -1) fatal("unable to switch to starting directory");
  close(wdir);
}